

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::push_label(S2Builder *this,Label label)

{
  Label label_local;
  S2LogMessage local_18;
  
  label_local = label;
  if (-1 < label) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->label_set_,&label_local);
    this->label_set_modified_ = true;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x126,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_18.stream_,"Check failed: (label) >= (0) ");
  abort();
}

Assistant:

void S2Builder::push_label(Label label) {
  S2_DCHECK_GE(label, 0);
  label_set_.push_back(label);
  label_set_modified_ = true;
}